

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  int *piVar4;
  undefined8 ridx_00;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  uint *puVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  long lVar23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  long lVar25;
  byte bVar26;
  int *local_548;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  pcVar24 = (cpp_dec_float<200U,_int,_void> *)eps2.m_backend.data._M_elems._0_8_;
  bVar26 = 0;
  puVar16 = (uint *)eps;
  puVar21 = local_b0;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar21 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar21 = puVar21 + 1;
  }
  local_40 = (eps->m_backend).exp;
  local_3c = (eps->m_backend).neg;
  local_38._0_4_ = (eps->m_backend).fpclass;
  local_38._4_4_ = (eps->m_backend).prec_elem;
  puVar16 = (uint *)eps2.m_backend.data._M_elems._0_8_;
  puVar21 = local_130;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar21 = *puVar16;
    puVar16 = puVar16 + 1;
    puVar21 = puVar21 + 1;
  }
  local_c0 = *(undefined4 *)(eps2.m_backend.data._M_elems._0_8_ + 0x70);
  local_bc = *(undefined1 *)(eps2.m_backend.data._M_elems._0_8_ + 0x74);
  local_b8 = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x78);
  vSolveLright2(this,rhs,ridx,&rn,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_b0,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_130);
  if (eps2.m_backend.data._M_elems._32_8_ == 0) {
    if (rn < 1) {
      uVar14 = 0;
    }
    else {
      piVar4 = (this->row).perm;
      lVar10 = 0;
      uVar14 = 0;
      do {
        iVar7 = ridx[lVar10];
        iVar6 = rhs[iVar7].m_backend.exp;
        bVar1 = rhs[iVar7].m_backend.neg;
        pcVar20 = &rhs[iVar7].m_backend;
        pnVar17 = &result;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar20->data)._M_elems[0];
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar26 * -8 + 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
        }
        result.m_backend.fpclass = rhs[iVar7].m_backend.fpclass;
        result.m_backend.prec_elem = rhs[iVar7].m_backend.prec_elem;
        pnVar17 = eps;
        pcVar20 = &local_430;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar20->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar26 * -2 + 1) * 4)
          ;
        }
        local_430.exp = (eps->m_backend).exp;
        local_430.neg = (eps->m_backend).neg;
        local_430.fpclass = (eps->m_backend).fpclass;
        local_430.prec_elem = (eps->m_backend).prec_elem;
        result.m_backend.neg = bVar1;
        if ((bVar1 == true) &&
           (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        result.m_backend.exp = iVar6;
        if ((local_430.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN
            ) || (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&result.m_backend,&local_430), iVar6 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (&rhs[iVar7].m_backend,0);
        }
        else {
          iVar7 = piVar4[iVar7];
          uVar12 = uVar14;
          if (0 < (int)uVar14) {
            do {
              uVar9 = uVar12 - 1;
              uVar15 = uVar9 >> 1;
              if (iVar7 <= ridx[uVar15]) break;
              ridx[uVar12] = ridx[uVar15];
              uVar12 = uVar15;
            } while (1 < uVar9);
          }
          uVar14 = uVar14 + 1;
          ridx[(int)uVar12] = iVar7;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < rn);
    }
  }
  else {
    if (rn < 1) {
      uVar14 = 0;
    }
    else {
      local_548 = (int *)eps2.m_backend.data._M_elems._48_8_;
      piVar4 = (this->row).perm;
      lVar10 = 0;
      uVar14 = 0;
      do {
        iVar7 = ridx[lVar10];
        lVar23 = (long)iVar7;
        lVar25 = lVar23 * 0x80;
        pcVar24 = &rhs[lVar23].m_backend;
        pcVar20 = pcVar24;
        pnVar17 = &result_2;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar20->data)._M_elems[0];
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar26 * -8 + 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
        }
        iVar6 = rhs[lVar23].m_backend.exp;
        bVar1 = rhs[lVar23].m_backend.neg;
        fVar2 = rhs[lVar23].m_backend.fpclass;
        iVar3 = rhs[lVar23].m_backend.prec_elem;
        pcVar20 = pcVar24;
        pnVar17 = &result;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pcVar20->data)._M_elems[0];
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar26 * -8 + 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
        }
        pnVar17 = eps;
        pcVar20 = &local_3b0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar20->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar26 * -2 + 1) * 4)
          ;
        }
        local_3b0.exp = (eps->m_backend).exp;
        local_3b0.neg = (eps->m_backend).neg;
        local_3b0.fpclass = (eps->m_backend).fpclass;
        local_3b0.prec_elem = (eps->m_backend).prec_elem;
        result.m_backend.prec_elem = iVar3;
        result.m_backend.fpclass = fVar2;
        result.m_backend.neg = bVar1;
        if ((bVar1 == true) &&
           (result.m_backend.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        result.m_backend.exp = iVar6;
        if ((local_3b0.fpclass == cpp_dec_float_NaN || fVar2 == cpp_dec_float_NaN) ||
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&result.m_backend,&local_3b0), iVar5 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar24,0);
        }
        else {
          *local_548 = iVar7;
          iVar7 = piVar4[lVar23];
          uVar12 = uVar14;
          if (0 < (int)uVar14) {
            do {
              uVar9 = uVar12 - 1;
              uVar15 = uVar9 >> 1;
              if (iVar7 <= ridx[uVar15]) break;
              ridx[uVar12] = ridx[uVar15];
              uVar12 = uVar15;
            } while (1 < uVar9);
          }
          local_548 = local_548 + 1;
          uVar14 = uVar14 + 1;
          ridx[(int)uVar12] = iVar7;
          pnVar17 = &result_2;
          puVar16 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + lVar25);
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar16 = (pnVar17->m_backend).data._M_elems[0];
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
            puVar16 = puVar16 + (ulong)bVar26 * -2 + 1;
          }
          *(int *)(eps2.m_backend.data._M_elems._32_8_ + 0x70 + lVar25) = iVar6;
          *(bool *)(eps2.m_backend.data._M_elems._32_8_ + 0x74 + lVar25) = bVar1;
          *(fpclass_type *)(eps2.m_backend.data._M_elems._32_8_ + 0x78 + lVar25) = fVar2;
          *(int32_t *)(eps2.m_backend.data._M_elems._32_8_ + 0x7c + lVar25) = iVar3;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < rn);
    }
    *(uint *)eps2.m_backend.data._M_elems._40_8_ = uVar14;
    pcVar24 = (cpp_dec_float<200U,_int,_void> *)eps2.m_backend.data._M_elems._0_8_;
  }
  rn = uVar14;
  if ((double)this->thedim * 0.2 < (double)(int)eps2.m_backend.data._M_elems[6]) {
    *(int *)eps2.m_backend.data._M_elems._16_8_ = this->thedim + -1;
    uVar14 = eps2.m_backend.data._M_elems[6];
  }
  else if ((int)eps2.m_backend.data._M_elems[6] < 1) {
    uVar14 = 0;
  }
  else {
    piVar4 = (this->row).perm;
    lVar10 = 0;
    uVar13 = 0;
    do {
      uVar14 = (uint)uVar13;
      lVar25 = (long)*(int *)(eps2.m_backend.data._M_elems._16_8_ + lVar10 * 4);
      lVar11 = lVar25 * 0x80;
      pcVar20 = (cpp_dec_float<200U,_int,_void> *)(eps2.m_backend.data._M_elems._8_8_ + lVar11);
      pcVar18 = pcVar20;
      pnVar17 = &result;
      for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar26 * -8 + 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      result.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x70 + lVar11);
      result.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x74 + lVar11);
      result.m_backend._120_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x78 + lVar11)
      ;
      pcVar18 = pcVar24;
      pnVar17 = &result_2;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar26 * -8 + 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      result_2.m_backend.exp = pcVar24->exp;
      result_2.m_backend.neg = pcVar24->neg;
      uVar8._0_4_ = pcVar24->fpclass;
      uVar8._4_4_ = pcVar24->prec_elem;
      if (result_2.m_backend.data._M_elems[0] != 0 || (undefined4)uVar8 != 0) {
        result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
      }
      result_2.m_backend._120_8_ = uVar8;
      uVar12 = uVar14;
      if (result.m_backend.fpclass == cpp_dec_float_NaN || (undefined4)uVar8 == 2) {
LAB_00535e64:
        if (((result.m_backend.fpclass != cpp_dec_float_NaN) && ((int)uVar8 != 2)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&result.m_backend,pcVar24), 0 < iVar7)) {
          iVar7 = piVar4[lVar25];
          if (0 < (int)uVar14) {
            do {
              uVar15 = (uint)uVar13 - 1;
              uVar9 = uVar15 >> 1;
              iVar6 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar9 * 4);
              uVar12 = (uint)uVar13;
              if (iVar7 <= iVar6) break;
              *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar13 * 4) = iVar6;
              uVar13 = (ulong)uVar9;
              uVar12 = uVar9;
            } while (1 < uVar15);
          }
          goto LAB_00535eff;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar20,0);
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&result.m_backend,&result_2.m_backend);
        if (-1 < iVar7) {
          uVar8 = (ulong)pcVar24->fpclass;
          goto LAB_00535e64;
        }
        iVar7 = piVar4[lVar25];
        if (0 < (int)uVar14) {
          do {
            uVar15 = (uint)uVar13 - 1;
            uVar9 = uVar15 >> 1;
            iVar6 = *(int *)(eps2.m_backend.data._M_elems._16_8_ + (ulong)uVar9 * 4);
            uVar12 = (uint)uVar13;
            if (iVar7 <= iVar6) break;
            *(int *)(eps2.m_backend.data._M_elems._16_8_ + uVar13 * 4) = iVar6;
            uVar13 = (ulong)uVar9;
            uVar12 = uVar9;
          } while (1 < uVar15);
        }
LAB_00535eff:
        uVar13 = (ulong)(uVar14 + 1);
        *(int *)(eps2.m_backend.data._M_elems._16_8_ + (long)(int)uVar12 * 4) = iVar7;
      }
      lVar10 = lVar10 + 1;
      uVar14 = (uint)uVar13;
    } while (lVar10 < (int)eps2.m_backend.data._M_elems[6]);
  }
  eps2.m_backend.data._M_elems[6] = uVar14;
  ridx_00 = eps2.m_backend.data._M_elems._16_8_;
  pnVar17 = eps;
  pnVar19 = &local_1b0;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar19->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = (eps->m_backend).exp;
  local_1b0.m_backend.neg = (eps->m_backend).neg;
  local_1b0.m_backend.fpclass = (eps->m_backend).fpclass;
  local_1b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
  rn = vSolveUright(this,vec,idx,rhs,ridx,rn,&local_1b0);
  pnVar17 = vec2;
  pcVar20 = pcVar24;
  pnVar19 = &local_230;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar19->m_backend).data._M_elems[0] = (pcVar20->data)._M_elems[0];
    pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar26 * -8 + 4);
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = pcVar24->exp;
  local_230.m_backend.neg = pcVar24->neg;
  local_230.m_backend.fpclass = pcVar24->fpclass;
  local_230.m_backend.prec_elem = pcVar24->prec_elem;
  vSolveUrightNoNZ(this,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)ridx_00,
                   eps2.m_backend.data._M_elems[6],&local_230);
  if ((this->l).updateType == 0) {
    pnVar19 = eps;
    pnVar22 = &local_2b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar22->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar26 * -2 + 1) * 4);
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar22 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = (eps->m_backend).exp;
    local_2b0.m_backend.neg = (eps->m_backend).neg;
    local_2b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_2b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this,vec,idx,rn,&local_2b0);
    pcVar20 = pcVar24;
    pnVar19 = &local_330;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pcVar20->data)._M_elems[0];
      pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar26 * -8 + 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = pcVar24->exp;
    local_330.m_backend.neg = pcVar24->neg;
    local_330.m_backend.fpclass = pcVar24->fpclass;
    local_330.m_backend.prec_elem = pcVar24->prec_elem;
    vSolveUpdateRightNoNZ(this,pnVar17,&local_330);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}